

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSampleShadingTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::SampleShadingApiCaseGroup::SampleShadingApiCase::iterate(SampleShadingApiCase *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ContextInfo *this_00;
  char *local_70;
  float local_50;
  int local_4c;
  GLfloat result;
  int i;
  Test tests [4];
  bool isOk;
  Functions *gl;
  SampleShadingApiCase *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  tests[3].result._3_1_ = 1;
  if (this->m_glslVersion == GLSL_VERSION_310_ES) {
    this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
    bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_OES_sample_shading");
    if (!bVar1) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_NOT_SUPPORTED,"GL_OES_sample_shading");
      return STOP;
    }
  }
  this->m_pGLMinSampleShading = *(glMinSampleShadingFunc *)(lVar5 + 0xdc8);
  _result = 0;
  tests[0].input = 0.5;
  tests[0].result = 0.5;
  tests[1].input = -1.0;
  tests[1].result = 0.0;
  tests[2].input = 2.0;
  tests[2].result = 1.0;
  for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
    (*this->m_pGLMinSampleShading)((&result)[(long)local_4c * 2]);
    local_50 = -1.0;
    (**(code **)(lVar5 + 0x818))(0x8c37,&local_50);
    if ((local_50 != tests[(long)local_4c + -1].result) ||
       (NAN(local_50) || NAN(tests[(long)local_4c + -1].result))) {
      tests[3].result._3_1_ = 0;
    }
  }
  (**(code **)(lVar5 + 0x5e0))(0x8c36);
  cVar2 = (**(code **)(lVar5 + 0xc70))(0x8c36);
  if (cVar2 == '\0') {
    tests[3].result._3_1_ = 0;
  }
  (**(code **)(lVar5 + 0x4e8))(0x8c36);
  cVar2 = (**(code **)(lVar5 + 0xc70))(0x8c36);
  if (cVar2 != '\0') {
    tests[3].result._3_1_ = 0;
  }
  (*this->m_pGLMinSampleShading)(0.0);
  if ((tests[3].result._3_1_ & 1) == 0) {
    local_70 = "Fail";
  }
  else {
    local_70 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (uint)((tests[3].result._3_1_ & 1) == 0),local_70);
  return STOP;
}

Assistant:

SampleShadingApiCaseGroup::SampleShadingApiCase::IterateResult SampleShadingApiCaseGroup::SampleShadingApiCase::
	iterate()
{
	const glw::Functions& gl   = m_context.getRenderContext().getFunctions();
	bool				  isOk = true;

	if (m_glslVersion == glu::GLSL_VERSION_310_ES &&
		!m_context.getContextInfo().isExtensionSupported("GL_OES_sample_shading"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_OES_sample_shading");
		return STOP;
	}

	m_pGLMinSampleShading = gl.minSampleShading;

	struct Test
	{
		GLfloat input;
		GLfloat result;
	} tests[] = {
		{ 0.0f, 0.0f }, { 0.5f, 0.5f }, { -1.0f, 0.0f }, { 2.0f, 1.0f },
	};
	for (int i = 0; i < DE_LENGTH_OF_ARRAY(tests); ++i)
	{
		m_pGLMinSampleShading(tests[i].input);
		GLfloat result = -1.0f;
		gl.getFloatv(GL_MIN_SAMPLE_SHADING_VALUE_OES, &result);
		if (result != tests[i].result)
		{
			isOk = false;
		}
	}

	gl.enable(GL_SAMPLE_SHADING_OES);
	if (!gl.isEnabled(GL_SAMPLE_SHADING_OES))
	{
		isOk = false;
	}
	gl.disable(GL_SAMPLE_SHADING_OES);
	if (gl.isEnabled(GL_SAMPLE_SHADING_OES))
	{
		isOk = false;
	}

	m_pGLMinSampleShading(0.0f);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, isOk ? "Pass" : "Fail");
	return STOP;
}